

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  string local_38;
  
  switch(other) {
  case nullValue:
    bVar1 = this->field_0x8;
    if ((ushort)(bVar1 - 1) < 3) {
      dVar4 = asDouble(this);
      bVar2 = 1;
      if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_004b1e56;
      bVar1 = this->field_0x8;
    }
    if ((bVar1 == 5) && (bVar2 = 1, (this->value_).bool_ == false)) goto LAB_004b1e56;
    bVar2 = bVar1;
    if (bVar1 == 4) {
      asString_abi_cxx11_(&local_38,this);
      if (local_38._M_string_length != 0) {
        bVar2 = this->field_0x8;
        goto LAB_004b1dba;
      }
      bVar2 = true;
    }
    else {
LAB_004b1dba:
      if (((bVar2 == 7) || (bVar2 == 6)) &&
         ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        bVar2 = true;
      }
      else {
        bVar2 = bVar2 == 0;
      }
      if (bVar1 != 4) goto LAB_004b1e56;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    goto LAB_004b1e56;
  case intValue:
    bVar3 = isInt(this);
    bVar2 = 1;
    if (bVar3) goto LAB_004b1e56;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar4 = (this->value_).real_, -2147483648.0 <= dVar4)) {
      dVar5 = 2147483647.0;
LAB_004b1e10:
      bVar2 = 1;
      if (dVar4 <= dVar5) goto LAB_004b1e56;
    }
    goto LAB_004b1e16;
  case uintValue:
    bVar3 = isUInt(this);
    bVar2 = 1;
    if (bVar3) goto LAB_004b1e56;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar4 = (this->value_).real_, 0.0 <= dVar4)) {
      dVar5 = 4294967295.0;
      goto LAB_004b1e10;
    }
LAB_004b1e16:
    bVar3 = bVar1 == 5;
    break;
  case realValue:
  case booleanValue:
    bVar1 = this->field_0x8;
    bVar2 = 1;
    if ((ushort)(bVar1 - 1) < 3) goto LAB_004b1e56;
    bVar3 = bVar1 == 5;
    break;
  case stringValue:
    bVar1 = this->field_0x8;
    bVar2 = 1;
    if (2 < (ushort)(bVar1 - 1)) {
      if (bVar1 < 6) {
        bVar2 = 0x31 >> (bVar1 & 0x1f);
      }
      else {
        bVar2 = 0;
      }
    }
    goto LAB_004b1e56;
  case arrayValue:
    bVar1 = this->field_0x8;
    bVar3 = bVar1 == 6;
    break;
  case objectValue:
    bVar1 = this->field_0x8;
    bVar3 = bVar1 == 7;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x3a2,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar2 = bVar1 == 0 | bVar3;
LAB_004b1e56:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString().empty()) ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}